

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall cs::statement_default::dump(statement_default *this,ostream *param_2)

{
  string *str;
  runtime_error *this_00;
  undefined1 local_31 [49];
  
  str = (string *)__cxa_allocate_exception(0x28);
  this_00 = (runtime_error *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_31 + 1),"Do not allowed standalone default statement.",
             (allocator *)this_00);
  runtime_error::runtime_error(this_00,str);
  __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void dump(std::ostream &) const override
		{
			throw runtime_error("Do not allowed standalone default statement.");
		}